

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

Result get_cart_infos(Emulator *e)

{
  Result RVar1;
  uint local_3c;
  u32 j;
  size_t offset;
  size_t sStack_28;
  u32 i;
  size_t max_file_size;
  size_t file_size;
  Emulator *e_local;
  
  sStack_28 = (e->file_data).size;
  max_file_size = sStack_28;
  file_size = (size_t)e;
  for (offset._4_4_ = 0;
      (offset._4_4_ < 0x100 &&
      ((ulong)(offset._4_4_ << 0xf) + 0x8000 <= *(ulong *)(file_size + 0x30)));
      offset._4_4_ = offset._4_4_ + 1) {
    RVar1 = get_cart_info((FileData *)(file_size + 0x28),(ulong)(offset._4_4_ << 0xf),
                          (CartInfo *)(file_size + 0x38 + (ulong)offset._4_4_ * 0x30),TRUE,
                          &stack0xffffffffffffffd8);
    if (RVar1 == OK) {
      if (s_cart_type_info[*(uint *)(file_size + (ulong)offset._4_4_ * 0x30 + 0x58)].mbc_type ==
          MBC_TYPE_MMM01) goto LAB_00108797;
      *(int *)(file_size + 0x3038) = *(int *)(file_size + 0x3038) + 1;
    }
  }
  if ((*(int *)(file_size + 0x3038) == 0) &&
     (RVar1 = get_cart_info((FileData *)(file_size + 0x28),0,(CartInfo *)(file_size + 0x38),FALSE,
                            &stack0xffffffffffffffd8), RVar1 == OK)) {
    *(int *)(file_size + 0x3038) = *(int *)(file_size + 0x3038) + 1;
  }
  if (*(int *)(file_size + 0x3038) == 0) {
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c",0x4a8)
    ;
    fprintf(_stderr,"Invalid ROM.\n");
    e_local._4_4_ = ERROR;
  }
  else {
    offset._4_4_ = 0;
LAB_00108797:
    if (max_file_size < sStack_28) {
      file_data_resize((FileData *)(file_size + 0x28),sStack_28);
      for (local_3c = 0; local_3c < *(uint *)(file_size + 0x3038); local_3c = local_3c + 1) {
        *(long *)(file_size + (ulong)local_3c * 0x30 + 0x40) =
             *(long *)(file_size + 0x28) + *(long *)(file_size + 0x38 + (ulong)local_3c * 0x30);
      }
    }
    set_cart_info((Emulator *)file_size,(u8)offset._4_4_);
    e_local._4_4_ = OK;
  }
  return e_local._4_4_;
}

Assistant:

static Result get_cart_infos(Emulator* e) {
  size_t file_size = e->file_data.size;
  size_t max_file_size = file_size;
  u32 i;
  for (i = 0; i < MAX_CART_INFOS; ++i) {
    size_t offset = i << CART_INFO_SHIFT;
    if (offset + MINIMUM_ROM_SIZE > e->file_data.size) break;
    if (SUCCESS(get_cart_info(&e->file_data, offset, &e->cart_infos[i], TRUE,
                              &max_file_size))) {
      if (s_cart_type_info[e->cart_infos[i].cart_type].mbc_type ==
          MBC_TYPE_MMM01) {
        /* MMM01 has the cart header at the end. */
        goto done;
      }
      e->cart_info_count++;
    }
  }
  // Maybe the logo checksum failed; try again without it required.
  if (e->cart_info_count == 0 &&
      SUCCESS(get_cart_info(&e->file_data, 0, &e->cart_infos[0], FALSE,
                            &max_file_size))) {
    e->cart_info_count++;
  }
  CHECK_MSG(e->cart_info_count != 0, "Invalid ROM.\n");
  i = 0;
done:
  if (max_file_size > file_size) {
    file_data_resize(&e->file_data, max_file_size);
    // Fix cart_info data pointers.
    for (u32 j = 0; j < e->cart_info_count; ++j) {
      e->cart_infos[j].data = e->file_data.data + e->cart_infos[j].offset;
    }
  }
  set_cart_info(e, i);
  return OK;
  ON_ERROR_RETURN;
}